

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  Btree *p;
  BtShared *pBt_00;
  BtCursor *local_30;
  BtCursor *pPrev;
  BtShared *pBt;
  int i;
  Btree *pBtree;
  BtCursor *pCur_local;
  
  p = pCur->pBtree;
  if (p != (Btree *)0x0) {
    pBt_00 = pCur->pBt;
    sqlite3BtreeEnter(p);
    sqlite3BtreeClearCursor(pCur);
    if (pBt_00->pCursor == pCur) {
      pBt_00->pCursor = pCur->pNext;
    }
    else {
      local_30 = pBt_00->pCursor;
      do {
        if (local_30->pNext == pCur) {
          local_30->pNext = pCur->pNext;
          break;
        }
        local_30 = local_30->pNext;
      } while (local_30 != (BtCursor *)0x0);
    }
    for (pBt._4_4_ = 0; pBt._4_4_ <= pCur->iPage; pBt._4_4_ = pBt._4_4_ + 1) {
      releasePage(pCur->apPage[pBt._4_4_]);
    }
    unlockBtreeIfUnused(pBt_00);
    sqlite3_free(pCur->aOverflow);
    sqlite3BtreeLeave(p);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    int i;
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    sqlite3BtreeClearCursor(pCur);
    assert( pBt->pCursor!=0 );
    if( pBt->pCursor==pCur ){
      pBt->pCursor = pCur->pNext;
    }else{
      BtCursor *pPrev = pBt->pCursor;
      do{
        if( pPrev->pNext==pCur ){
          pPrev->pNext = pCur->pNext;
          break;
        }
        pPrev = pPrev->pNext;
      }while( ALWAYS(pPrev) );
    }
    for(i=0; i<=pCur->iPage; i++){
      releasePage(pCur->apPage[i]);
    }
    unlockBtreeIfUnused(pBt);
    sqlite3_free(pCur->aOverflow);
    /* sqlite3_free(pCur); */
    sqlite3BtreeLeave(pBtree);
  }
  return SQLITE_OK;
}